

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

CPDeclIdx cp_add(CPDecl *decl,CTInfo info,CTSize size)

{
  uint uVar1;
  CPDeclIdx top;
  CTSize size_local;
  CTInfo info_local;
  CPDecl *decl_local;
  
  uVar1 = decl->top;
  if (99 < uVar1) {
    cp_err(decl->cp,LJ_ERR_XLEVELS);
  }
  decl->stack[uVar1].info = info;
  decl->stack[uVar1].size = size;
  decl->stack[uVar1].sib = 0;
  decl->stack[uVar1].name.gcptr64 = 0;
  decl->stack[uVar1].next = decl->stack[decl->pos].next;
  decl->stack[decl->pos].next = (CTypeID1)uVar1;
  decl->top = uVar1 + 1;
  return uVar1;
}

Assistant:

static CPDeclIdx cp_add(CPDecl *decl, CTInfo info, CTSize size)
{
  CPDeclIdx top = decl->top;
  if (top >= CPARSE_MAX_DECLSTACK) cp_err(decl->cp, LJ_ERR_XLEVELS);
  decl->stack[top].info = info;
  decl->stack[top].size = size;
  decl->stack[top].sib = 0;
  setgcrefnull(decl->stack[top].name);
  decl->stack[top].next = decl->stack[decl->pos].next;
  decl->stack[decl->pos].next = (CTypeID1)top;
  decl->top = top+1;
  return top;
}